

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O3

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Linear<spoa::InstructionSet<(spoa::Architecture)3,short>>
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  undefined8 *puVar1;
  type_conflict *ptVar2;
  uint *puVar3;
  undefined2 uVar4;
  AlignmentType AVar5;
  uint uVar6;
  __mxxxi *palVar7;
  __mxxxi *palVar8;
  byte bVar9;
  __mxxxi alVar10;
  undefined1 auVar11 [32];
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint32_t j_1;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  Implementation *pIVar21;
  pointer ppNVar22;
  pointer ppVar23;
  uint uVar24;
  pointer ppEVar25;
  pointer ppVar26;
  uint uVar27;
  ulong uVar28;
  undefined4 uVar29;
  iterator __position;
  ulong uVar30;
  __mxxxi *palVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  __mxxxi *palVar36;
  ulong uVar37;
  long lVar38;
  Node *pNVar39;
  uint uVar40;
  iterator __begin5;
  pointer ppEVar41;
  bool bVar42;
  undefined1 auVar44 [16];
  undefined1 auVar43 [16];
  __mxxxi alVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  int iVar53;
  undefined1 in_ZMM0 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 in_ZMM6 [64];
  int32_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> predecessors;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
  backtrack_storage;
  type unpacked [16];
  uint local_150;
  uint local_14c;
  pointer local_148;
  ulong local_140;
  pointer local_138;
  pointer local_130;
  type_conflict *local_128;
  Graph *local_120;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  type_conflict *local_f0;
  ulong local_e8;
  uint local_e0;
  uint local_dc;
  ulong local_d8;
  long local_d0;
  uint local_c4;
  __mxxxi local_c0;
  pointer local_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  auVar56 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sequence_len);
  uVar19 = 0;
  uVar24 = 0;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar56._0_8_ * 0.0625;
  auVar56 = vroundsd_avx(auVar43,auVar43,10);
  uVar28 = vcvttsd2usi_avx512f(auVar56);
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  do {
    *(undefined2 *)((long)&local_80 + uVar19 * 2) = 0x8400;
    if (((uint)uVar19 + 1 & (uint)uVar19 & 0xfffffffe) == 0) {
      uVar30 = (ulong)uVar24;
      uVar24 = uVar24 + 1;
      palVar31 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->masks + uVar30;
      (*palVar31)[0] = local_80;
      (*palVar31)[1] = lStack_78;
      (*palVar31)[2] = lStack_70;
      (*palVar31)[3] = lStack_68;
    }
  } while ((uVar19 < 0xf) && (uVar19 = uVar19 + 1, uVar24 < 4));
  palVar31 = ((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl)->masks;
  palVar31[4][0] = -0x7bff7bff7c000000;
  palVar31[4][1] = -0x7bff7bff7bff7c00;
  palVar31[4][2] = -0x7bff7bff7bff7c00;
  palVar31[4][3] = -0x7bff7bff7bff7c00;
  alVar45 = (__mxxxi)vpbroadcastw_avx512vl();
  *((this->pimpl_)._M_t.
    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ._M_t.
    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    .
    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
   ._M_head_impl)->penalties = alVar45;
  lVar20 = 0x20;
  do {
    palVar31 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl)->penalties;
    auVar46 = *(undefined1 (*) [32])((long)palVar31[-1] + lVar20);
    auVar46 = vpaddw_avx2(auVar46,auVar46);
    *(undefined1 (*) [32])((long)*palVar31 + lVar20) = auVar46;
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0x80);
  ppNVar22 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138 = (pointer)(graph->rank_to_node_).
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)ppNVar22 == local_138) {
LAB_00112162:
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return (Alignment *)
           (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)__return_storage_ptr__;
  }
  auVar54._8_2_ = 0x8400;
  auVar54._0_8_ = 0x8400840084008400;
  auVar54._10_2_ = 0x8400;
  auVar54._12_2_ = 0x8400;
  auVar54._14_2_ = 0x8400;
  auVar54._16_2_ = 0x8400;
  auVar54._18_2_ = 0x8400;
  auVar54._20_2_ = 0x8400;
  auVar54._22_2_ = 0x8400;
  auVar54._24_2_ = 0x8400;
  auVar54._26_2_ = 0x8400;
  auVar54._28_2_ = 0x8400;
  auVar54._30_2_ = 0x8400;
  auVar56._8_2_ = 0x7fff;
  auVar56._0_8_ = 0x7fff7fff7fff7fff;
  auVar56._10_2_ = 0x7fff;
  auVar56._12_2_ = 0x7fff;
  auVar56._14_2_ = 0x7fff;
  local_140 = (ulong)(sequence_len - 1);
  uVar19 = 0xffffffff;
  auVar46 = vpbroadcastw_avx512vl();
  local_130 = (pointer)CONCAT44(local_130._4_4_,(int)(this->super_AlignmentEngine).g_);
  uVar29 = 0x8400;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    uVar29 = 0;
  }
  local_128 = (type_conflict *)(ulong)(sequence_len - 1 & 0xf);
  local_148 = (pointer)CONCAT44(local_148._4_4_,uVar29);
  do {
    pNVar39 = *ppNVar22;
    pIVar21 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    lVar20 = *(long *)&(pIVar21->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    ppEVar41 = (pNVar39->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppEVar25 = (pNVar39->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (ppEVar41 == ppEVar25) {
      uVar30 = 0;
    }
    else {
      uVar30 = (ulong)(*(int *)(lVar20 + (ulong)(*ppEVar41)->tail->id * 4) + 1);
    }
    lVar38 = pNVar39->code * uVar28;
    palVar31 = pIVar21->H;
    palVar7 = pIVar21->sequence_profile;
    uVar24 = *(int *)(lVar20 + (ulong)pNVar39->id * 4) + 1;
    palVar36 = palVar31 + uVar24 * uVar28;
    if (uVar28 != 0) {
      lVar33 = uVar30 * uVar28;
      uVar4 = *(undefined2 *)
               (*(long *)&(pIVar21->first_column).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl + uVar30 * 4);
      lVar20 = 0;
      auVar57 = vpsrldq_avx2(ZEXT1632(CONCAT214(uVar4,CONCAT212(uVar4,CONCAT210(uVar4,CONCAT28(uVar4
                                                  ,CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,
                                                  uVar4)))))))),0xe);
      uVar30 = uVar28;
      do {
        auVar55 = *(undefined1 (*) [32])((long)palVar31[lVar33] + lVar20);
        auVar47 = vperm2i128_avx2(auVar55,auVar55,0x28);
        auVar55 = vpalignr_avx2(auVar55,auVar47,0xe);
        auVar57 = vpor_avx2(auVar55,auVar57);
        auVar43 = *(undefined1 (*) [16])((long)palVar31[lVar33] + lVar20 + 0x10);
        *(undefined1 (*) [32])((long)*palVar36 + lVar20) = auVar57;
        auVar55 = vpaddw_avx2(auVar57,*(undefined1 (*) [32])((long)palVar7[lVar38] + lVar20));
        auVar47 = vpaddw_avx2(auVar46,*(undefined1 (*) [32])((long)palVar31[lVar33] + lVar20));
        auVar57 = vpsrldq_avx2(ZEXT1632(auVar43),0xe);
        auVar55 = vpmaxsw_avx2(auVar55,auVar47);
        in_ZMM6 = ZEXT3264(auVar55);
        *(undefined1 (*) [32])((long)*palVar36 + lVar20) = auVar55;
        lVar20 = lVar20 + 0x20;
        uVar30 = uVar30 - 1;
      } while (uVar30 != 0);
      pNVar39 = *ppNVar22;
      ppEVar41 = (pNVar39->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar25 = (pNVar39->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    if (8 < (ulong)((long)ppEVar25 - (long)ppEVar41)) {
      uVar30 = 1;
      do {
        if (uVar28 != 0) {
          pIVar21 = (this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                    ._M_head_impl;
          uVar34 = (ulong)(*(int *)(*(long *)&(pIVar21->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)ppEVar41[uVar30]->tail->id * 4) + 1);
          uVar4 = *(undefined2 *)
                   (*(long *)&(pIVar21->first_column).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl + uVar34 * 4);
          lVar20 = uVar34 * uVar28;
          palVar31 = pIVar21->H;
          lVar33 = 0;
          auVar57 = vpsrldq_avx2(ZEXT1632(CONCAT214(uVar4,CONCAT212(uVar4,CONCAT210(uVar4,CONCAT28(
                                                  uVar4,CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4
                                                  ,uVar4)))))))),0xe);
          uVar34 = uVar28;
          do {
            auVar55 = *(undefined1 (*) [32])((long)palVar31[lVar20] + lVar33);
            auVar47 = vperm2i128_avx2(auVar55,auVar55,0x28);
            auVar47 = vpalignr_avx2(auVar55,auVar47,0xe);
            auVar55 = vpaddw_avx2(auVar46,auVar55);
            auVar57 = vpor_avx2(auVar47,auVar57);
            auVar57 = vpaddw_avx2(auVar57,*(undefined1 (*) [32])((long)palVar7[lVar38] + lVar33));
            auVar57 = vpmaxsw_avx2(auVar57,auVar55);
            auVar55 = vpmaxsw_avx2(auVar57,*(undefined1 (*) [32])((long)*palVar36 + lVar33));
            in_ZMM6 = ZEXT3264(auVar55);
            auVar57 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                             ((long)palVar31[lVar20] + lVar33 + 0x10)),0xe);
            *(undefined1 (*) [32])((long)*palVar36 + lVar33) = auVar55;
            lVar33 = lVar33 + 0x20;
            uVar34 = uVar34 - 1;
          } while (uVar34 != 0);
          pNVar39 = *ppNVar22;
        }
        ppEVar41 = (pNVar39->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar30 = (ulong)((int)uVar30 + 1);
      } while (uVar30 < (ulong)((long)(pNVar39->inedges).
                                      super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar41 >>
                               3));
    }
    auVar55 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar57 = auVar54;
    if (uVar28 != 0) {
      auVar43 = vpbroadcastw_avx512vl();
      in_ZMM6._0_32_ = vpsrldq_avx2(ZEXT1632(auVar43),0xe);
      palVar31 = palVar36;
      uVar30 = uVar28;
      do {
        auVar47 = vorpd_avx(in_ZMM6._0_32_,
                            (undefined1  [32])
                            ((this->pimpl_)._M_t.
                             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                             .
                             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                            ._M_head_impl)->masks[4]);
        alVar45 = (__mxxxi)vpmaxsw_avx2(auVar47,(undefined1  [32])*palVar31);
        *palVar31 = alVar45;
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        palVar7 = pIVar21->masks;
        palVar8 = pIVar21->penalties;
        auVar47 = vpaddw_avx2((undefined1  [32])alVar45,(undefined1  [32])*palVar8);
        auVar11 = vperm2i128_avx2(auVar47,auVar47,0x28);
        auVar47 = vpalignr_avx2(auVar47,auVar11,0xe);
        auVar47 = vpor_avx2(auVar47,(undefined1  [32])*palVar7);
        alVar45 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar45,auVar47);
        *palVar31 = alVar45;
        auVar47 = vpaddw_avx2((undefined1  [32])alVar45,(undefined1  [32])palVar8[1]);
        auVar11 = vperm2i128_avx2(auVar47,auVar47,0x28);
        auVar47 = vpalignr_avx2(auVar47,auVar11,0xc);
        auVar47 = vpor_avx2(auVar47,(undefined1  [32])palVar7[1]);
        alVar45 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar45,auVar47);
        *palVar31 = alVar45;
        auVar47 = vpaddw_avx2((undefined1  [32])alVar45,(undefined1  [32])palVar8[2]);
        auVar47 = valignq_avx512vl(auVar47,auVar55,3);
        auVar47 = vpor_avx2(auVar47,(undefined1  [32])palVar7[2]);
        alVar45 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar45,auVar47);
        *palVar31 = alVar45;
        auVar47 = vpaddw_avx2((undefined1  [32])alVar45,(undefined1  [32])palVar8[3]);
        auVar47 = vperm2i128_avx2(auVar47,auVar47,0x28);
        auVar47 = vpor_avx2(auVar47,(undefined1  [32])palVar7[3]);
        alVar45 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar45,auVar47);
        *palVar31 = alVar45;
        alVar10 = alVar45;
        if ((this->super_AlignmentEngine).type_ == kSW) {
          alVar10 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar45,auVar55);
          *palVar31 = alVar10;
        }
        palVar31 = palVar31 + 1;
        auVar57 = vpmaxsw_avx2(auVar57,(undefined1  [32])alVar10);
        uVar30 = uVar30 - 1;
        auVar43 = vpaddw_avx(alVar45._16_16_,auVar46._16_16_);
        auVar47 = vpsrldq_avx2(ZEXT1632(auVar43),0xe);
        in_ZMM6 = ZEXT3264(auVar47);
      } while (uVar30 != 0);
    }
    AVar5 = (this->super_AlignmentEngine).type_;
    if (AVar5 == kSW) {
LAB_0011204a:
      auVar57 = vpmaxsw_avx2(auVar57,auVar55);
      in_ZMM6 = ZEXT1664(auVar57._16_16_);
      auVar43 = vpmaxsw_avx(auVar57._0_16_,auVar57._16_16_);
      auVar43 = vphminposuw_avx(auVar43 ^ auVar56);
      uVar27 = auVar43._0_4_ ^ 0x7fff;
LAB_0011209e:
      if ((short)local_148 < (short)uVar27) {
        uVar19 = (ulong)uVar24;
      }
      uVar24 = (uint)local_148;
      if ((short)local_148 <= (short)uVar27) {
        uVar24 = uVar27;
      }
      local_148 = (pointer)CONCAT44(local_148._4_4_,uVar24);
    }
    else if (AVar5 == kNW) {
      if (((*ppNVar22)->outedges).
          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          ((*ppNVar22)->outedges).
          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_c0 = palVar36[uVar28 - 1];
        uVar27 = (uint)*(ushort *)((long)local_c0 + (long)local_128 * 2);
        goto LAB_0011209e;
      }
    }
    else if ((AVar5 == kOV) &&
            (((*ppNVar22)->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start ==
             ((*ppNVar22)->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish)) goto LAB_0011204a;
    ppNVar22 = ppNVar22 + 1;
  } while ((pointer)ppNVar22 != local_138);
  iVar32 = (int)uVar19;
  if (iVar32 == -1) goto LAB_00112162;
  if (score != (int32_t *)0x0) {
    *score = (int)(short)local_148;
  }
  if (AVar5 == kOV) {
    pNVar39 = (graph->rank_to_node_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start[(long)iVar32 + -1];
    if ((pNVar39->outedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(pNVar39->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl + 8)) goto LAB_00112203;
    if ((uVar28 & 0xffffffff) != 0) {
      uVar30 = 0;
      iVar53 = 0;
      do {
        lVar20 = 0;
        local_c0 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H[(long)iVar32 * uVar28 + uVar30];
        do {
          if (*(short *)((long)local_c0 + lVar20 * 2) == (short)local_148) goto LAB_001121fc;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        uVar30 = uVar30 + 1;
        iVar53 = iVar53 + -0x10;
      } while (uVar30 != (uVar28 & 0xffffffff));
    }
  }
  else {
    if (AVar5 == kNW) goto LAB_00112203;
    if ((AVar5 == kSW) && ((uVar28 & 0xffffffff) != 0)) {
      uVar30 = 0;
      iVar53 = 0;
      do {
        lVar20 = 0;
        local_c0 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H[(long)iVar32 * uVar28 + uVar30];
        do {
          if (*(short *)((long)local_c0 + lVar20 * 2) == (short)local_148) goto LAB_001121fc;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        uVar30 = uVar30 + 1;
        iVar53 = iVar53 + -0x10;
      } while (uVar30 != (uVar28 & 0xffffffff));
    }
  }
  local_140 = 0xffffffff;
LAB_00112203:
  if (iVar32 == 0) {
    iVar53 = 1;
  }
  else {
    auVar46._8_4_ = 1;
    auVar46._0_8_ = 0x100000001;
    auVar46._12_4_ = 1;
    auVar46._16_4_ = 1;
    auVar46._20_4_ = 1;
    auVar46._24_4_ = 1;
    auVar46._28_4_ = 1;
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar49 = vpbroadcastq_avx512f();
    uVar30 = 0;
    do {
      auVar54 = auVar46;
      auVar50 = vpbroadcastq_avx512f();
      auVar50 = vporq_avx512f(auVar50,auVar48);
      uVar34 = vpcmpuq_avx512f(auVar50,auVar49,2);
      vmovdqu64_avx512f(*(undefined1 (*) [64])
                         ((graph->rank_to_node_).
                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar30));
      uVar30 = uVar30 + 8;
      auVar50 = vpgatherqq_avx512f(*(undefined8 *)(uVar28 + 0x10));
      bVar9 = (byte)uVar34;
      auVar51._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * auVar50._8_8_;
      auVar51._0_8_ = (ulong)(bVar9 & 1) * auVar50._0_8_;
      auVar51._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * auVar50._16_8_;
      auVar51._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * auVar50._24_8_;
      auVar51._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * auVar50._32_8_;
      auVar51._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * auVar50._40_8_;
      auVar51._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * auVar50._48_8_;
      auVar51._56_8_ = (uVar34 >> 7) * auVar50._56_8_;
      auVar50 = vpgatherqq_avx512f(*(undefined8 *)(uVar28 + 8));
      auVar52._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * auVar50._8_8_;
      auVar52._0_8_ = (ulong)(bVar9 & 1) * auVar50._0_8_;
      auVar52._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * auVar50._16_8_;
      auVar52._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * auVar50._24_8_;
      auVar52._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * auVar50._32_8_;
      auVar52._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * auVar50._40_8_;
      auVar52._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * auVar50._48_8_;
      auVar52._56_8_ = (uVar34 >> 7) * auVar50._56_8_;
      auVar50 = vpsubq_avx512f(auVar51,auVar52);
      auVar50 = vpsrlq_avx512f(auVar50,3);
      auVar46 = vpmovqd_avx512f(auVar50);
      auVar46 = vpmaxud_avx2(auVar54,auVar46);
    } while ((uVar19 + 7 & 0xfffffffffffffff8) != uVar30);
    auVar46 = vmovdqa32_avx512vl(auVar46);
    auVar44._0_4_ = (uint)(bVar9 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar54._0_4_;
    bVar42 = (bool)((byte)(uVar34 >> 1) & 1);
    auVar44._4_4_ = (uint)bVar42 * auVar46._4_4_ | (uint)!bVar42 * auVar54._4_4_;
    bVar42 = (bool)((byte)(uVar34 >> 2) & 1);
    auVar44._8_4_ = (uint)bVar42 * auVar46._8_4_ | (uint)!bVar42 * auVar54._8_4_;
    bVar42 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar44._12_4_ = (uint)bVar42 * auVar46._12_4_ | (uint)!bVar42 * auVar54._12_4_;
    bVar42 = (bool)((byte)(uVar34 >> 4) & 1);
    auVar57._16_4_ = (uint)bVar42 * auVar46._16_4_ | (uint)!bVar42 * auVar54._16_4_;
    auVar57._0_16_ = auVar44;
    bVar42 = (bool)((byte)(uVar34 >> 5) & 1);
    auVar57._20_4_ = (uint)bVar42 * auVar46._20_4_ | (uint)!bVar42 * auVar54._20_4_;
    bVar42 = (bool)((byte)(uVar34 >> 6) & 1);
    auVar57._24_4_ = (uint)bVar42 * auVar46._24_4_ | (uint)!bVar42 * auVar54._24_4_;
    bVar42 = SUB81(uVar34 >> 7,0);
    auVar57._28_4_ = (uint)bVar42 * auVar46._28_4_ | (uint)!bVar42 * auVar54._28_4_;
    auVar56 = vpmaxud_avx(auVar44,auVar57._16_16_);
    auVar43 = vpshufd_avx(auVar56,0xee);
    auVar56 = vpmaxud_avx(auVar56,auVar43);
    auVar43 = vpshufd_avx(auVar56,0x55);
    auVar56 = vpmaxud_avx(auVar56,auVar43);
    iVar53 = auVar56._0_4_;
  }
  local_120 = graph;
  local_118 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
              __return_storage_ptr__;
  local_f0 = (type_conflict *)score;
  std::
  vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
  ::vector((vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
            *)local_c0,(ulong)(iVar53 * 0x20 + 0x30),(allocator_type *)&local_110);
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138 = (pointer)local_c0[0];
  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_14c = (uint)local_140;
  *(pointer *)(local_118 + 0x10) = (pointer)0x0;
  *(undefined1 (*) [16])local_118 = (undefined1  [16])0x0;
  if ((local_14c == 0xffffffff) || (iVar32 == 0)) {
LAB_0011288b:
    uVar24 = (uint)uVar19;
  }
  else {
    local_e8 = 0;
    uVar24 = 0;
    local_148 = (pointer)(local_c0[0] + 0x20);
    local_f0 = ((pointer)(local_c0[0] + 0x20))->arr + (uint)(iVar53 << 4);
    local_128 = local_f0 + (uint)(iVar53 << 4);
    bVar42 = true;
    uVar30 = local_140;
    do {
      local_e0 = (uint)(uVar30 >> 4) & 0xfffffff;
      local_d0 = (long)((int)uVar19 + -1);
      local_140 = uVar30;
      local_dc = uVar24;
      local_d8 = uVar19;
      if (bVar42) {
        __position._M_current =
             local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          __position._M_current =
               local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        local_130 = (pointer)((ulong)local_e0 * 0x20);
        local_88 = (local_120->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        palVar31 = (__mxxxi *)
                   ((long)local_130 +
                   (long)(((this->pimpl_)._M_t.
                           super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                           .
                           super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                          ._M_head_impl)->H + (long)(int)uVar19 * uVar28));
        lVar12 = (*palVar31)[1];
        lVar13 = (*palVar31)[2];
        lVar14 = (*palVar31)[3];
        *(longlong *)local_138->arr = (*palVar31)[0];
        *(longlong *)(local_138->arr + 4) = lVar12;
        *(longlong *)(local_138->arr + 8) = lVar13;
        *(longlong *)(local_138->arr + 0xc) = lVar14;
        ppEVar25 = (local_88[local_d0]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar41 = *(pointer *)
                    ((long)&(local_88[local_d0]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar25 == ppEVar41) {
          local_150 = 0;
          if (__position._M_current ==
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                      (&local_110,__position,(int *)&local_150);
          }
          else {
            *__position._M_current = 0;
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          puVar1 = (undefined8 *)
                   ((long)*((this->pimpl_)._M_t.
                            super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            .
                            super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                           ._M_head_impl)->H + (long)local_130);
          uVar15 = puVar1[1];
          uVar16 = puVar1[2];
          uVar17 = puVar1[3];
          *(undefined8 *)local_148->arr = *puVar1;
          *(undefined8 *)(local_148->arr + 4) = uVar15;
          *(undefined8 *)(local_148->arr + 8) = uVar16;
          *(undefined8 *)(local_148->arr + 0xc) = uVar17;
        }
        else {
          uVar19 = 0;
          do {
            pIVar21 = (this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                      ._M_head_impl;
            local_150 = *(int *)(*(long *)&(pIVar21->node_id_to_rank).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                + (ulong)(*ppEVar25)->tail->id * 4) + 1;
            if (__position._M_current ==
                local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(&local_110,__position,&local_150);
              pIVar21 = (this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        .
                        super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                        ._M_head_impl;
              __position._M_current =
                   local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish;
            }
            else {
              *__position._M_current = local_150;
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
              __position._M_current = __position._M_current + 1;
            }
            ppEVar25 = ppEVar25 + 1;
            puVar1 = (undefined8 *)
                     ((long)local_130 + (long)(pIVar21->H + __position._M_current[-1] * uVar28));
            uVar15 = puVar1[1];
            uVar16 = puVar1[2];
            uVar17 = puVar1[3];
            ptVar2 = local_148->arr + uVar19;
            *(undefined8 *)ptVar2 = *puVar1;
            *(undefined8 *)(ptVar2 + 4) = uVar15;
            *(undefined8 *)(ptVar2 + 8) = uVar16;
            *(undefined8 *)(ptVar2 + 0xc) = uVar17;
            uVar19 = (ulong)((int)uVar19 + 0x10);
          } while (ppEVar25 != ppEVar41);
        }
        puVar1 = (undefined8 *)
                 ((long)local_130 +
                 (long)(((this->pimpl_)._M_t.
                         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                         .
                         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                        ._M_head_impl)->sequence_profile + local_88[local_d0]->code * uVar28));
        uVar15 = puVar1[1];
        uVar16 = puVar1[2];
        uVar17 = puVar1[3];
        *(undefined8 *)(local_128 + 0x10) = *puVar1;
        *(undefined8 *)(local_128 + 0x14) = uVar15;
        *(undefined8 *)(local_128 + 0x18) = uVar16;
        *(undefined8 *)(local_128 + 0x1c) = uVar17;
      }
      uVar27 = local_14c;
      uVar18 = (uint)local_140 & 0xf;
      if (((this->super_AlignmentEngine).type_ == kSW) &&
         (uVar19 = local_d8, local_138->arr[uVar18] == 0)) goto LAB_0011288b;
      uVar6 = (uint)local_d8;
      if ((local_140 & 0xf) == 0) {
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        if ((uint)local_140 < 0x10) {
          lVar20 = *(long *)&(pIVar21->first_column).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl;
          local_128[0xf] = *(type_conflict *)(lVar20 + (long)(int)uVar6 * 4);
          uVar19 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar34 = 0;
            uVar30 = 0xf;
            do {
              puVar3 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar34;
              uVar34 = uVar34 + 1;
              local_f0[uVar30] = *(type_conflict *)(lVar20 + (ulong)*puVar3 * 4);
              uVar30 = (ulong)((int)uVar30 + 0x10);
            } while ((uVar34 & 0xffffffff) < uVar19);
          }
        }
        else {
          palVar31 = pIVar21->H + (long)(int)uVar6 * uVar28 + ((ulong)local_e0 - 1);
          lVar12 = *(longlong *)((long)*palVar31 + 8);
          lVar13 = *(longlong *)((long)*palVar31 + 0x10);
          lVar14 = *(longlong *)((long)*palVar31 + 0x18);
          *(longlong *)local_128 = (*palVar31)[0];
          *(longlong *)(local_128 + 4) = lVar12;
          *(longlong *)(local_128 + 8) = lVar13;
          *(longlong *)(local_128 + 0xc) = lVar14;
          uVar19 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar34 = 0;
            uVar30 = 0;
            do {
              puVar3 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar34;
              uVar34 = uVar34 + 1;
              palVar31 = ((this->pimpl_)._M_t.
                          super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                          .
                          super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                         ._M_head_impl)->H + *puVar3 * uVar28 + ((ulong)local_e0 - 1);
              lVar12 = *(longlong *)((long)*palVar31 + 8);
              lVar13 = *(longlong *)((long)*palVar31 + 0x10);
              lVar14 = *(longlong *)((long)*palVar31 + 0x18);
              ptVar2 = local_f0 + uVar30;
              *(longlong *)ptVar2 = (*palVar31)[0];
              *(longlong *)(ptVar2 + 4) = lVar12;
              *(longlong *)(ptVar2 + 8) = lVar13;
              *(longlong *)(ptVar2 + 0xc) = lVar14;
              uVar30 = (ulong)((int)uVar30 + 0x10);
              local_130 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
            } while ((uVar34 & 0xffffffff) < uVar19);
          }
        }
      }
      else {
        uVar19 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
      }
      if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
LAB_001127a7:
        uVar24 = local_dc;
        uVar40 = uVar6;
        if ((local_140 & 0xf) == 0) {
          if ((int)(this->super_AlignmentEngine).g_ + (int)local_128[0xf] == (int)local_138->arr[0])
          goto LAB_001127eb;
        }
        else if ((int)(this->super_AlignmentEngine).g_ + (int)local_138->arr[(ulong)uVar18 - 1] ==
                 (int)local_138->arr[uVar18]) {
LAB_001127eb:
          uVar24 = local_14c - 1;
          goto LAB_001127ed;
        }
      }
      else {
        uVar24 = uVar18 - 1;
        uVar37 = 0xf;
        uVar30 = 1;
        uVar34 = 0;
        do {
          uVar35 = uVar30;
          local_130 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          if ((local_140 & 0xf) == 0) {
            if ((int)local_128[0x10] + (int)local_f0[uVar37] == (int)local_138->arr[0])
            goto LAB_001126cb;
          }
          else if ((int)*(short *)((long)local_128 + (ulong)(uVar18 * 2) + 0x20) +
                   (int)local_138[1].arr[uVar24] ==
                   (int)*(short *)((long)local_138->arr + (ulong)(uVar18 * 2))) {
LAB_001126cb:
            uVar40 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar34];
            goto LAB_001127eb;
          }
          uVar24 = uVar24 + 0x10;
          uVar37 = (ulong)((int)uVar37 + 0x10);
          uVar30 = (ulong)((int)uVar35 + 1);
          uVar34 = uVar35;
        } while (uVar35 < uVar19);
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) goto LAB_001127a7;
        iVar32 = (int)(this->super_AlignmentEngine).g_;
        if (local_138[1].arr[uVar18] + iVar32 == (int)local_138->arr[uVar18]) {
          uVar34 = 0;
        }
        else {
          uVar30 = 1;
          uVar24 = uVar18;
          do {
            uVar34 = uVar30;
            uVar24 = uVar24 + 0x10;
            if (uVar19 <= uVar34) goto LAB_001127a7;
            uVar30 = (ulong)((int)uVar34 + 1);
          } while (local_148->arr[uVar24] + iVar32 != (int)local_138->arr[uVar18]);
        }
        uVar40 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar34];
        uVar24 = local_14c;
LAB_001127ed:
        local_e8 = (ulong)uVar24;
        uVar24 = uVar40;
      }
      local_150 = 0xffffffff;
      if (uVar6 != uVar24) {
        local_150 = (local_120->rank_to_node_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_d0]->id;
      }
      local_c4 = local_14c;
      if (local_14c == (uint)local_e8) {
        local_c4 = 0xffffffff;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int,int>(local_118,&local_150,(int *)&local_c4);
      bVar42 = true;
      local_14c = (uint)local_e8;
      if (uVar6 == uVar24) {
        bVar42 = (~local_14c & 0xf) == 0 && uVar27 != local_14c;
      }
      if (local_14c == 0xffffffff) break;
      uVar30 = local_e8 & 0xffffffff;
      uVar19 = (ulong)uVar24;
    } while (uVar24 != 0);
  }
  if ((this->super_AlignmentEngine).type_ == kNW) {
    uVar27 = local_14c;
    if (local_14c != 0xffffffff && uVar24 == 0) {
      do {
        local_150 = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                  (local_118,(int *)&local_150,(int *)&local_14c);
        bVar42 = local_14c != 0;
        local_14c = local_14c - 1;
      } while (bVar42);
      uVar27 = 0xffffffff;
    }
    if (uVar27 == 0xffffffff && uVar24 != 0) {
      ppNVar22 = (local_120->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        lVar20 = (long)(int)uVar24;
        local_150 = 0xffffffff;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int>(local_118,&ppNVar22[lVar20 + -1]->id,(int *)&local_150);
        ppNVar22 = (local_120->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar25 = (ppNVar22[lVar20 + -1]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar41 = *(pointer *)
                    ((long)&(ppNVar22[lVar20 + -1]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar25 == ppEVar41) break;
        pIVar21 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        lVar38 = *(long *)&(pIVar21->first_column).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl;
        do {
          uVar27 = *(int *)(*(long *)&(pIVar21->node_id_to_rank).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           + (ulong)(*ppEVar25)->tail->id * 4) + 1;
          if (*(int *)(lVar38 + lVar20 * 4) ==
              *(int *)(lVar38 + (ulong)uVar27 * 4) + (int)(this->super_AlignmentEngine).g_) break;
          ppEVar25 = ppEVar25 + 1;
          uVar27 = uVar24;
        } while (ppEVar25 != ppEVar41);
        uVar24 = uVar27;
        if ((uVar24 == 0) || (local_14c != 0xffffffff)) break;
      }
    }
  }
  ppVar23 = *(pointer *)local_118;
  ppVar26 = *(pointer *)(local_118 + 8) + -1;
  if (ppVar23 < ppVar26 && ppVar23 != *(pointer *)(local_118 + 8)) {
    do {
      iVar32 = ppVar23->first;
      ppVar23->first = ppVar26->first;
      ppVar26->first = iVar32;
      iVar32 = ppVar23->second;
      ppVar23->second = ppVar26->second;
      ppVar26->second = iVar32;
      ppVar23 = ppVar23 + 1;
      ppVar26 = ppVar26 + -1;
    } while (ppVar23 < ppVar26);
  }
  if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_c0[0] == (pointer)0x0) {
    return (Alignment *)local_118;
  }
  operator_delete((void *)local_c0[0],local_c0[2] - local_c0[0],0x20);
  return (Alignment *)local_118;
LAB_001121fc:
  local_140 = (ulong)(uint)((int)lVar20 - iVar53);
  goto LAB_00112203;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::uint64_t normal_matrix_width = sequence_len;
  std::uint64_t matrix_width =
      std::ceil(static_cast<double>(sequence_len) / T::kNumVar);
  const auto& rank_to_node = graph.rank_to_node();

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {0};  // NOLINT

  for (std::uint32_t i = 0, j = 0; i < T::kNumVar && j < T::kLogNumVar; ++i) {
    unpacked[i] = kNegativeInfinity;
    if ((i & (i + 1)) == 0) {
      pimpl_->masks[j++] = _mmxxx_load_si(
        reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }
  pimpl_->masks[T::kLogNumVar] = _mmxxx_slli_si(
      T::_mmxxx_set1_epi(kNegativeInfinity),
      T::kLSS);

  pimpl_->penalties[0] = T::_mmxxx_set1_epi(g_);
  for (std::uint32_t i = 1; i < T::kLogNumVar; ++i) {
    pimpl_->penalties[i] = T::_mmxxx_add_epi(
        pimpl_->penalties[i - 1],
        pimpl_->penalties[i - 1]);
  }

  typename T::type max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;  // NOLINT
  std::int32_t max_i = -1;
  std::int32_t max_j = -1;
  std::uint32_t last_column_id = (normal_matrix_width - 1) % T::kNumVar;
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);
  __mxxxi g = T::_mmxxx_set1_epi(g_);

  // alignment
  for (const auto& it : rank_to_node) {
    __mxxxi* char_profile = &(pimpl_->sequence_profile[it->code * matrix_width]);  // NOLINT

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    __mxxxi* H_row = &(pimpl_->H[i * matrix_width]);
    __mxxxi* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    __mxxxi x = _mmxxx_srli_si(
        T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // get diagonal
      __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
      H_row[j] = _mmxxx_or_si(
          _mmxxx_slli_si(H_pred_row[j], T::kLSS),
          x);
      x = t1;

      // update M
      H_row[j] = T::_mmxxx_max_epi(
          T::_mmxxx_add_epi(H_row[j], char_profile[j]),
          T::_mmxxx_add_epi(H_pred_row[j], g));
    }
    // check other predecessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      x = _mmxxx_srli_si(
          T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
          T::kRSS);

      for (std::uint64_t j = 0; j < matrix_width; ++j) {
        // get diagonal
        __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
        __mxxxi m = _mmxxx_or_si(
            _mmxxx_slli_si(H_pred_row[j], T::kLSS),
            x);
        x = t1;

        // updage M
        H_row[j] = T::_mmxxx_max_epi(
            H_row[j],
            T::_mmxxx_max_epi(
                T::_mmxxx_add_epi(m, char_profile[j]),
                T::_mmxxx_add_epi(H_pred_row[j], g)));
      }
    }

    __mxxxi score = T::_mmxxx_set1_epi(kNegativeInfinity);
    x = _mmxxx_srli_si(
        T::_mmxxx_add_epi(
            T::_mmxxx_set1_epi(pimpl_->first_column[i]),
            g),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // add last element of previous vector into this one
      H_row[j] = T::_mmxxx_max_epi(
          H_row[j],
          _mmxxx_or_si(x, pimpl_->masks[T::kLogNumVar]));

      T::_mmxxx_prefix_max(H_row[j], pimpl_->masks, pimpl_->penalties);

      x = _mmxxx_srli_si(
          T::_mmxxx_add_epi(H_row[j], g),
          T::kRSS);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = T::_mmxxx_max_epi(H_row[j], zeroes);
      }
      score = T::_mmxxx_max_epi(score, H_row[j]);
    }

    if (type_ == AlignmentType::kSW) {
      std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
      if (max_score < max_row_score) {
        max_score = max_row_score;
        max_i = i;
      }
    } else if (type_ == AlignmentType::kOV) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    } else if (type_ == AlignmentType::kNW) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_value_at<A, T>(
            H_row[matrix_width - 1],
            last_column_id);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    }
  }

  if (max_i == -1 && max_j == -1) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  if (type_ == AlignmentType::kSW) {
    max_j = _mmxxx_index_of<A, T>(
        &(pimpl_->H[max_i * matrix_width]),
        matrix_width,
        max_score);
  } else if (type_ == AlignmentType::kOV) {
    if (rank_to_node[max_i - 1]->outedges.empty()) {
      max_j = _mmxxx_index_of<A, T>(
          &(pimpl_->H[max_i * matrix_width]),
          matrix_width,
          max_score);
    } else {
      max_j = normal_matrix_width - 1;
    }
  } else if (type_ == AlignmentType::kNW) {
    max_j = normal_matrix_width - 1;
  }

  // backtrack
  std::uint32_t max_num_predecessors = 1;
  for (std::uint32_t i = 0; i < static_cast<std::uint32_t>(max_i); ++i) {
    max_num_predecessors = std::max(
        max_num_predecessors,
        static_cast<std::uint32_t>(rank_to_node[i]->inedges.size()));
  }

  std::vector<typename T::Storage> backtrack_storage(3 * T::kNumVar + 2 * T::kNumVar * max_num_predecessors);
  typename T::type* H = reinterpret_cast<typename T::type*>(backtrack_storage.data());
  typename T::type* H_pred = H + T::kNumVar;
  typename T::type* H_diag_pred = H_pred + T::kNumVar * max_num_predecessors;
  typename T::type* H_left_pred = H_diag_pred + T::kNumVar * max_num_predecessors;  // NOLINT
  typename T::type* profile = H_left_pred + T::kNumVar;

  std::vector<std::uint32_t> predecessors;

  std::int32_t i = max_i;
  std::int32_t j = max_j;
  std::int32_t prev_i = 0, prev_j = 0;

  std::uint32_t j_div = j / T::kNumVar;
  std::uint32_t j_mod = j % T::kNumVar;

  bool load_next_segment = true;

  Alignment alignment;

  do {
    // check stop condition
    if (j == -1 || i == 0) {
      break;
    }

    const auto& it = rank_to_node[i - 1];
    // load everything
    if (load_next_segment) {
      predecessors.clear();

      // load current cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(H),
          pimpl_->H[i * matrix_width + j_div]);

      // load predecessors cells
      if (it->inedges.empty()) {
        predecessors.emplace_back(0);
        _mmxxx_store_si(reinterpret_cast<__mxxxi*>(H_pred), pimpl_->H[j_div]);
      } else {
        std::uint32_t store_pos = 0;
        for (const auto& jt : it->inedges) {
          predecessors.emplace_back(pimpl_->node_id_to_rank[jt->tail->id] + 1);
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_pred[store_pos * T::kNumVar]),
              pimpl_->H[predecessors.back() * matrix_width + j_div]);
          ++store_pos;
        }
      }

      // load query profile cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(profile),
          pimpl_->sequence_profile[it->code * matrix_width + j_div]);
    }

    // check stop condition
    if (type_ == AlignmentType::kSW && H[j_mod] == 0) {
      break;
    }

    if (j_mod == 0) {
      // border case
      if (j_div > 0) {
        _mmxxx_store_si(
            reinterpret_cast<__mxxxi*>(H_left_pred),
            pimpl_->H[i * matrix_width + j_div - 1]);

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_diag_pred[p * T::kNumVar]),
              pimpl_->H[predecessors[p] * matrix_width + (j_div - 1)]);
        }
      } else {
        H_left_pred[T::kNumVar - 1] = pimpl_->first_column[i];

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          H_diag_pred[(p + 1) * T::kNumVar - 1] =
              pimpl_->first_column[predecessors[p]];
        }
      }
    }

    // find best predecessor cell
    bool predecessor_found = false;

    if (i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if ((j_mod == 0 && H[j_mod] == H_diag_pred[(p + 1) * T::kNumVar - 1] + profile[j_mod]) ||  // NOLINT
            (j_mod != 0 && H[j_mod] == H_pred[p * T::kNumVar + j_mod - 1] + profile[j_mod])) {  // NOLINT
          prev_i = predecessors[p];
          prev_j = j - 1;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found && i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if (H[j_mod] == H_pred[p * T::kNumVar + j_mod] + g_) {
          prev_i = predecessors[p];
          prev_j = j;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found) {
      if ((j_mod == 0 && H[j_mod] == H_left_pred[T::kNumVar - 1] + g_) ||
          (j_mod != 0 && H[j_mod] == H[j_mod - 1] + g_)) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j);

    // update for next round
    load_next_segment =
        (i == prev_i ? false : true) ||
        (j != prev_j && prev_j % T::kNumVar == T::kNumVar - 1 ? true : false);

    i = prev_i;
    j = prev_j;
    j_div = j / T::kNumVar;
    j_mod = j % T::kNumVar;
  } while (true);

  // update alignment for NW (backtrack stops on first row or column)
  if (type_ == AlignmentType::kNW) {
    while (i == 0 && j != -1) {
      alignment.emplace_back(-1, j);
      --j;
    }
    while (i != 0 && j == -1) {
      alignment.emplace_back(rank_to_node[i - 1]->id, -1);

      const auto& it = rank_to_node[i - 1];
      if (it->inedges.empty()) {
          i = 0;
      } else {
        for (const auto& jt : it->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[jt->tail->id] + 1;
          if (pimpl_->first_column[i] == pimpl_->first_column[pred_i] + g_) {
            i = pred_i;
            break;
          }
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
#else
  (void) sequence_len;
  (void) graph;
  (void) score;
  return Alignment();
#endif
}